

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

string * format(string *__return_storage_ptr__,string *fmt_str,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  type pcVar3;
  pointer __s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  allocator<char> local_75 [13];
  undefined4 local_68;
  undefined4 local_64;
  va_list ap;
  unique_ptr<char[],_std::default_delete<char[]>_> local_48;
  unique_ptr<char[],_std::default_delete<char[]>_> formatted;
  string str;
  int n;
  int final_n;
  string *fmt_str_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  iVar1 = std::__cxx11::string::size();
  str.field_2._8_4_ = iVar1 << 1;
  std::__cxx11::string::string((string *)&formatted);
  std::unique_ptr<char[],std::default_delete<char[]>>::unique_ptr<std::default_delete<char[]>,void>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&local_48);
  while( true ) {
    pcVar2 = (char *)operator_new__((long)(int)str.field_2._8_4_);
    std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
              ((unique_ptr<char[],std::default_delete<char[]>> *)&local_48,pcVar2);
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[](&local_48,0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    strcpy(pcVar3,pcVar2);
    ap[0].overflow_arg_area = local_128;
    ap[0]._0_8_ = &stack0x00000008;
    local_64 = 0x30;
    local_68 = 0x10;
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[](&local_48,0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = vsnprintf(pcVar3,(long)(int)str.field_2._8_4_,pcVar2,&local_68);
    if ((-1 < iVar1) && (iVar1 < (int)str.field_2._8_4_)) break;
    iVar1 = (iVar1 - str.field_2._8_4_) + 1;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    str.field_2._8_4_ = iVar1 + str.field_2._8_4_;
  }
  __s = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,local_75);
  std::allocator<char>::~allocator(local_75);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_48);
  std::__cxx11::string::~string((string *)&formatted);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const std::string fmt_str, ...) {
    int final_n, n = ((int)fmt_str.size()) * 2; /* reserve 2 times as much as the length of the fmt_str */
    std::string str;
    std::unique_ptr<char[]> formatted;
    va_list ap;
    while(1) {
        formatted.reset(new char[n]); /* wrap the plain char array into the unique_ptr */
        strcpy(&formatted[0], fmt_str.c_str());
        va_start(ap, fmt_str);
        final_n = vsnprintf(&formatted[0], n, fmt_str.c_str(), ap);
        va_end(ap);
        if (final_n < 0 || final_n >= n)
            n += abs(final_n - n + 1);
        else
            break;
    }
    return std::string(formatted.get());
}